

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::
make_tuple<(pybind11::return_value_policy)1,pybind11::object&,pybind11::str,pybind11::int_>
          (pybind11 *this,object *args_,str *args__1,int_ *args__2)

{
  object *poVar1;
  PyObject *pPVar2;
  undefined8 uVar3;
  cast_error *this_00;
  long lVar4;
  array<pybind11::object,_3UL> args;
  
  pPVar2 = (args_->super_handle).m_ptr;
  if (pPVar2 == (PyObject *)0x0) {
    args._M_elems[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
    args._M_elems[0] = (object)(args_->super_handle).m_ptr;
  }
  pPVar2 = (args__1->super_object).super_handle.m_ptr;
  if (pPVar2 == (PyObject *)0x0) {
    args._M_elems[1].super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
    args._M_elems[1].super_handle.m_ptr = (handle)(args__1->super_object).super_handle.m_ptr;
  }
  pPVar2 = (args__2->super_object).super_handle.m_ptr;
  if (pPVar2 == (PyObject *)0x0) {
    args._M_elems[2].super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    pPVar2->ob_refcnt = pPVar2->ob_refcnt + 1;
    args._M_elems[2].super_handle.m_ptr = (handle)(args__2->super_object).super_handle.m_ptr;
  }
  lVar4 = 0;
  do {
    if (lVar4 == 3) {
      tuple::tuple((tuple *)this,3);
      for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
        uVar3 = *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar4);
        *(undefined8 *)((long)&args._M_elems[0].super_handle.m_ptr + lVar4) = 0;
        *(undefined8 *)(*(long *)this + 0x18 + lVar4) = uVar3;
      }
      std::array<pybind11::object,_3UL>::~array(&args);
      return (object)(object)this;
    }
    poVar1 = args._M_elems + lVar4;
    lVar4 = lVar4 + 1;
  } while ((poVar1->super_handle).m_ptr != (PyObject *)0x0);
  this_00 = (cast_error *)__cxa_allocate_exception(0x10);
  cast_error::runtime_error
            (this_00,
             "make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)"
            );
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}